

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdstddht.cc
# Opt level: O1

int bdStdLoadNodeId(bdNodeId *id,string *input)

{
  char cVar1;
  pointer pcVar2;
  int iVar3;
  int i;
  long lVar4;
  byte bVar5;
  byte bVar6;
  
  iVar3 = 0;
  if (0x27 < input->_M_string_length) {
    lVar4 = 0;
    do {
      pcVar2 = (input->_M_dataplus)._M_p;
      cVar1 = pcVar2[lVar4 * 2];
      bVar6 = cVar1 - 0x30;
      if (9 < bVar6) {
        if ((byte)(cVar1 + 0xbfU) < 6) {
          bVar6 = cVar1 - 0x37;
        }
        else {
          bVar6 = cVar1 + 0xa9;
          if (5 < (byte)(cVar1 + 0x9fU)) {
            bVar6 = 0;
          }
        }
      }
      cVar1 = pcVar2[lVar4 * 2 + 1];
      bVar5 = cVar1 - 0x30;
      if (9 < bVar5) {
        if ((byte)(cVar1 + 0xbfU) < 6) {
          bVar5 = cVar1 - 0x37;
        }
        else {
          bVar5 = cVar1 + 0xa9;
          if (5 < (byte)(cVar1 + 0x9fU)) {
            bVar5 = 0;
          }
        }
      }
      id->data[lVar4] = bVar6 * '\x10' + bVar5;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x14);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int  bdStdLoadNodeId(bdNodeId *id, std::string input) {
	uint8_t *a_data = (uint8_t *) id->data;
	uint32_t reqlen = BITDHT_KEY_LEN * 2;
	if (input.size() < reqlen)
		return 0;

	for (int i = 0; i < BITDHT_KEY_LEN; i++)	{
		char ch1 = input[2 * i];
		char ch2 = input[2 * i + 1];
		uint8_t value1 = 0;
		uint8_t value2 = 0;

		/* do char1 */
        	if (ch1 >= '0' && ch1 <= '9')
            		value1 = (ch1 - '0');
        	else if (ch1 >= 'A' && ch1 <= 'F')
            		value1 = (ch1 - 'A' + 10);
        	else if (ch1 >= 'a' && ch1 <= 'f')
            		value1 = (ch1 - 'a' + 10);

		/* do char2 */
        	if (ch2 >= '0' && ch2 <= '9')
            		value2 = (ch2 - '0');
        	else if (ch2 >= 'A' && ch2 <= 'F')
            		value2 = (ch2 - 'A' + 10);
        	else if (ch2 >= 'a' && ch2 <= 'f')
            		value2 = (ch2 - 'a' + 10);

		a_data[i] = (value1 << 4) + value2;
	}
	return 1;
}